

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm_debug.cpp
# Opt level: O2

void lvm_debug_p(void)

{
  ostream *poVar1;
  int iVar2;
  int i;
  long lVar3;
  
  iVar2 = 0;
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
    iVar2 = iVar2 + 1;
    poVar1 = std::operator<<((ostream *)&std::cout,"R");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)lVar3);
    std::operator<<(poVar1,"--------->");
    printf("%08X\t",(ulong)*register_list[lVar3]);
    if (iVar2 == 3) {
      putchar(10);
      iVar2 = 0;
    }
  }
  printf("IP--------->%08X\n",(ulong)registe_ptr->IP);
  printf("SP--------->%08X\t",(ulong)registe_ptr->SP);
  printf("BP--------->%08X\n",(ulong)registe_ptr->BP);
  printf("CS--------->%08X\n",(ulong)registe_ptr->CS);
  printf("DS--------->%08X\n",(ulong)registe_ptr->DS);
  printf("flag[0]--------->%02x\t",(ulong)(uint)(int)registe_ptr->flag[0]);
  printf("flag[1]--------->%02x\t",(ulong)(uint)(int)registe_ptr->flag[1]);
  printf("flag[14]--------->%02x\n",(ulong)(uint)(int)registe_ptr->flag[0xe]);
  return;
}

Assistant:

void lvm_debug_p() {
	int count{ 0 };
	for (int i = 0; i < 8; i++)
	{
		++count;
		std::cout << "R" << i << "--------->";
		printf("%08X	", *register_list[i]);
		if (count == 3) {
			count = 0;
			printf("\n");
		}
	}
	printf("IP--------->%08X\n", registe_ptr->IP);
	printf("SP--------->%08X	", registe_ptr->SP);
	printf("BP--------->%08X\n", registe_ptr->BP);
	printf("CS--------->%08X\n", registe_ptr->CS);
	printf("DS--------->%08X\n", registe_ptr->DS);
	printf("flag[0]--------->%02x	", registe_ptr->flag[0]);
	printf("flag[1]--------->%02x	", registe_ptr->flag[1]);
	printf("flag[14]--------->%02x\n", registe_ptr->flag[14]);
}